

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O0

String * __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::BuildParameterName_abi_cxx11_
          (String *__return_storage_ptr__,ConversionStream *this,
          vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
          *MemberStack,Char Separator,Char *Prefix,Char *SubstituteInstName,Char *Index)

{
  bool bVar1;
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*const_*,_std::vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>_>
  local_60;
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*const_*,_std::vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>_>
  local_58;
  const_iterator it;
  allocator local_3a;
  undefined1 local_39;
  char *local_38;
  Char *SubstituteInstName_local;
  Char *Prefix_local;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  *pvStack_20;
  Char Separator_local;
  vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
  *MemberStack_local;
  ConversionStream *this_local;
  String *FullName;
  
  local_39 = 0;
  local_38 = SubstituteInstName;
  SubstituteInstName_local = Prefix;
  Prefix_local._7_1_ = Separator;
  pvStack_20 = MemberStack;
  MemberStack_local =
       (vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
        *)this;
  this_local = (ConversionStream *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,Prefix,&local_3a);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a);
  local_58._M_current =
       (ShaderParameterInfo **)
       std::
       vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
       ::begin(pvStack_20);
  if (*local_38 == '\0') {
    __gnu_cxx::
    __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*const_*,_std::vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>_>
    ::operator*(&local_58);
    std::__cxx11::string::c_str();
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __gnu_cxx::
  __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*const_*,_std::vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>_>
  ::operator++(&local_58);
  while( true ) {
    local_60._M_current =
         (ShaderParameterInfo **)
         std::
         vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>
         ::end(pvStack_20);
    bVar1 = __gnu_cxx::operator!=(&local_58,&local_60);
    if (!bVar1) break;
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*const_*,_std::vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>_>
    ::operator*(&local_58);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    __gnu_cxx::
    __normal_iterator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*const_*,_std::vector<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*,_std::allocator<const_Diligent::HLSL2GLSLConverterImpl::ConversionStream::ShaderParameterInfo_*>_>_>
    ::operator++(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

String HLSL2GLSLConverterImpl::ConversionStream::BuildParameterName(
    const std::vector<const ShaderParameterInfo*>& MemberStack,
    Char                                           Separator,
    const Char*                                    Prefix,
    const Char*                                    SubstituteInstName,
    const Char*                                    Index) const
{
    String FullName(Prefix);
    auto   it = MemberStack.begin();
    FullName.append(*SubstituteInstName != 0 ? SubstituteInstName : (*it)->Name.c_str());
    FullName.append(Index);
    ++it;
    for (; it != MemberStack.end(); ++it)
    {
        FullName.push_back(Separator);
        FullName.append((*it)->Name);
    }
    return FullName;
}